

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O3

void __thiscall RTLsTy::UnregisterLib(RTLsTy *this,__tgt_bin_desc *desc)

{
  PendingCtorsDtorsPerLibrary *pPVar1;
  RTLInfoTy *pRVar2;
  pointer pDVar3;
  pointer ppRVar4;
  int iVar5;
  int32_t iVar6;
  mapped_type *pmVar7;
  long lVar8;
  _Base_ptr p_Var9;
  __tgt_offload_entry *p_Var10;
  const_iterator __position;
  pointer ppRVar11;
  pthread_mutex_t *__mutex;
  int iVar12;
  _List_node_base *p_Var13;
  __tgt_device_image *p_Var14;
  pair<std::_Rb_tree_iterator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>,_std::_Rb_tree_iterator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  pVar15;
  pair<std::_Rb_tree_iterator<std::pair<void_*const,_TableMap>_>,_std::_Rb_tree_iterator<std::pair<void_*const,_TableMap>_>_>
  pVar16;
  __tgt_bin_desc *desc_local;
  long local_48;
  PendingCtorsDtorsPerLibrary *local_40;
  pthread_mutex_t *local_38;
  
  desc_local = desc;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&RTLsMtx);
  if (iVar5 == 0) {
    if (0 < desc->NumDeviceImages) {
      local_48 = 0;
LAB_00104e82:
      ppRVar4 = RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        p_Var14 = desc->DeviceImages + local_48;
        ppRVar11 = RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        do {
          pRVar2 = *ppRVar11;
          iVar6 = (*pRVar2->is_valid_binary)(p_Var14);
          if (iVar6 != 0) {
            if (0 < pRVar2->NumberOfDevices) {
              iVar12 = 0;
              goto LAB_00104ed0;
            }
            break;
          }
          ppRVar11 = ppRVar11 + 1;
        } while (ppRVar11 != ppRVar4);
      }
      goto LAB_00104fa0;
    }
LAB_00104fbe:
    pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&TblMapMtx);
    if (iVar5 == 0) {
      p_Var10 = desc_local->HostEntriesBegin;
      if (p_Var10 < desc_local->HostEntriesEnd) {
        do {
          pVar16 = std::
                   _Rb_tree<void_*,_std::pair<void_*const,_TableMap>,_std::_Select1st<std::pair<void_*const,_TableMap>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_TableMap>_>_>
                   ::equal_range(&HostPtrToTableMap._M_t,&p_Var10->addr);
          std::
          _Rb_tree<void_*,_std::pair<void_*const,_TableMap>,_std::_Select1st<std::pair<void_*const,_TableMap>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_TableMap>_>_>
          ::_M_erase_aux(&HostPtrToTableMap._M_t,(_Base_ptr)pVar16.first._M_node,
                         (_Base_ptr)pVar16.second._M_node);
          p_Var10 = p_Var10 + 1;
        } while (p_Var10 < desc_local->HostEntriesEnd);
      }
      if (HostEntriesBeginToTransTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)0x0) {
        __position._M_node =
             &HostEntriesBeginToTransTable._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var10 = desc_local->HostEntriesBegin;
        p_Var9 = HostEntriesBeginToTransTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        do {
          if (*(__tgt_offload_entry **)(p_Var9 + 1) >= p_Var10) {
            __position._M_node = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[*(__tgt_offload_entry **)(p_Var9 + 1) < p_Var10];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)__position._M_node !=
             &HostEntriesBeginToTransTable._M_t._M_impl.super__Rb_tree_header) &&
           (*(__tgt_offload_entry **)(__position._M_node + 1) <= p_Var10)) {
          std::
          _Rb_tree<__tgt_offload_entry_*,_std::pair<__tgt_offload_entry_*const,_TranslationTable>,_std::_Select1st<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
          ::_M_erase_aux(&HostEntriesBeginToTransTable._M_t,__position);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&TblMapMtx);
      return;
    }
  }
LAB_0010507f:
  std::__throw_system_error(iVar5);
  while( true ) {
    pPVar1 = &pDVar3[lVar8].PendingCtorsDtors;
    pmVar7 = std::
             map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
             ::operator[](pPVar1,&desc_local);
    if ((mapped_type *)
        (pmVar7->PendingCtors).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
        super__List_node_base._M_next == pmVar7) {
      local_40 = pPVar1;
      local_38 = __mutex;
      pmVar7 = std::
               map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
               ::operator[](pPVar1,&desc_local);
      for (p_Var13 = (pmVar7->PendingDtors).super__List_base<void_*,_std::allocator<void_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next; pPVar1 = local_40,
          p_Var13 != (_List_node_base *)&pmVar7->PendingDtors; p_Var13 = p_Var13->_M_next) {
        target((long)pDVar3[lVar8].DeviceID,p_Var13[1]._M_next,0,(void **)0x0,(void **)0x0,
               (int64_t *)0x0,(int64_t *)0x0,1,1,1);
      }
      pVar15 = std::
               _Rb_tree<__tgt_bin_desc_*,_std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>,_std::_Select1st<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
               ::equal_range(&local_40->_M_t,&desc_local);
      std::
      _Rb_tree<__tgt_bin_desc_*,_std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>,_std::_Select1st<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
      ::_M_erase_aux(&pPVar1->_M_t,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node)
      ;
      __mutex = local_38;
    }
    pthread_mutex_unlock(__mutex);
    iVar12 = iVar12 + 1;
    if (pRVar2->NumberOfDevices <= iVar12) break;
LAB_00104ed0:
    pDVar3 = Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)iVar12 + (long)pRVar2->Idx;
    __mutex = (pthread_mutex_t *)
              &Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8].PendingGlobalsMtx;
    iVar5 = pthread_mutex_lock(__mutex);
    if (iVar5 != 0) goto LAB_0010507f;
  }
LAB_00104fa0:
  local_48 = local_48 + 1;
  desc = desc_local;
  if (desc_local->NumDeviceImages <= local_48) goto LAB_00104fbe;
  goto LAB_00104e82;
}

Assistant:

void RTLsTy::UnregisterLib(__tgt_bin_desc *desc) {
  DP("Unloading target library!\n");

  RTLsMtx.lock();
  // Find which RTL understands each image, if any.
  for (int32_t i = 0; i < desc->NumDeviceImages; ++i) {
    // Obtain the image.
    __tgt_device_image *img = &desc->DeviceImages[i];

    RTLInfoTy *FoundRTL = NULL;

    // Scan the RTLs that have associated images until we find one that supports
    // the current image. We only need to scan RTLs that are already being used.
    for (auto *R : RTLs.UsedRTLs) {

      assert(R->isUsed && "Expecting used RTLs.");

      if (!R->is_valid_binary(img)) {
        DP("Image " DPxMOD " is NOT compatible with RTL " DPxMOD "!\n",
            DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));
        continue;
      }

      DP("Image " DPxMOD " is compatible with RTL " DPxMOD "!\n",
          DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));

      FoundRTL = R;

      // Execute dtors for static objects if the device has been used, i.e.
      // if its PendingCtors list has been emptied.
      for (int32_t i = 0; i < FoundRTL->NumberOfDevices; ++i) {
        DeviceTy &Device = Devices[FoundRTL->Idx + i];
        Device.PendingGlobalsMtx.lock();
        if (Device.PendingCtorsDtors[desc].PendingCtors.empty()) {
          for (auto &dtor : Device.PendingCtorsDtors[desc].PendingDtors) {
            // TODO(Keren): do not monitor these ctors?
            int rc = target(Device.DeviceID, dtor, 0, NULL, NULL, NULL, NULL, 1,
                1, true /*team*/);
            if (rc != OFFLOAD_SUCCESS) {
              DP("Running destructor " DPxMOD " failed.\n", DPxPTR(dtor));
            }
          }
          // Remove this library's entry from PendingCtorsDtors
          Device.PendingCtorsDtors.erase(desc);
        }
        Device.PendingGlobalsMtx.unlock();
      }

      DP("Unregistered image " DPxMOD " from RTL " DPxMOD "!\n",
          DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));

      break;
    }

    // if no RTL was found proceed to unregister the next image
    if (!FoundRTL){
      DP("No RTLs in use support the image " DPxMOD "!\n",
          DPxPTR(img->ImageStart));
    }
  }
  RTLsMtx.unlock();
  DP("Done unregistering images!\n");

  // Remove entries from HostPtrToTableMap
  TblMapMtx.lock();
  for (__tgt_offload_entry *cur = desc->HostEntriesBegin;
      cur < desc->HostEntriesEnd; ++cur) {
    HostPtrToTableMap.erase(cur->addr);
  }

  // Remove translation table for this descriptor.
  auto tt = HostEntriesBeginToTransTable.find(desc->HostEntriesBegin);
  if (tt != HostEntriesBeginToTransTable.end()) {
    DP("Removing translation table for descriptor " DPxMOD "\n",
        DPxPTR(desc->HostEntriesBegin));
    HostEntriesBeginToTransTable.erase(tt);
  } else {
    DP("Translation table for descriptor " DPxMOD " cannot be found, probably "
        "it has been already removed.\n", DPxPTR(desc->HostEntriesBegin));
  }

  TblMapMtx.unlock();

  // TODO: Remove RTL and the devices it manages if it's not used anymore?
  // TODO: Write some RTL->unload_image(...) function?

  DP("Done unregistering library!\n");
}